

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O1

void __thiscall irr::io::SNamedPath::SNamedPath(SNamedPath *this,path *p)

{
  (this->Path).str._M_dataplus._M_p = (pointer)&(this->Path).str.field_2;
  (this->Path).str._M_string_length = 0;
  (this->Path).str.field_2._M_local_buf[0] = '\0';
  if (this != (SNamedPath *)p) {
    ::std::__cxx11::string::_M_assign((string *)this);
  }
  PathToName(&this->InternalName,this,p);
  return;
}

Assistant:

SNamedPath(const path &p) :
			Path(p), InternalName(PathToName(p))
	{
	}